

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::AddLinkLibraryForTarget
          (cmMakefile *this,string *target,string *lib,cmTargetLinkLibraryType llt)

{
  bool bVar1;
  iterator iVar2;
  cmTarget *this_00;
  ostream *poVar3;
  char *pcVar4;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->Targets)._M_h,target);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Attempt to add link library \"",0x1d);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(lib->_M_dataplus)._M_p,lib->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" to target \"",0xd);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(target->_M_dataplus)._M_p,target->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"\" which is not built in this directory.",0x27);
    std::__cxx11::stringbuf::str();
    IssueMessage(this,FATAL_ERROR,&local_1c8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  else {
    this_00 = cmGlobalGenerator::FindTarget(this->GlobalGenerator,lib,false);
    if ((this_00 != (cmTarget *)0x0) &&
       ((INTERFACE_LIBRARY < this_00->TargetTypeValue ||
        ((0x86U >> (this_00->TargetTypeValue & 0x1f) & 1) == 0)))) {
      bVar1 = cmTarget::IsExecutableWithExports(this_00);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(lib->_M_dataplus)._M_p,lib->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" of type ",10);
        pcVar4 = cmState::GetTargetTypeName(this_00->TargetTypeValue);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3," may not be linked into another target.  ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"One may link only to STATIC or SHARED libraries, or ",0x34);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"to executables with the ENABLE_EXPORTS property set.",0x34);
        std::__cxx11::stringbuf::str();
        IssueMessage(this,FATAL_ERROR,&local_1c8,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
    }
    cmTarget::AddLinkLibrary
              ((cmTarget *)
               ((long)iVar2.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                      ._M_cur + 0x28),this,target,lib,llt);
  }
  return;
}

Assistant:

void cmMakefile::AddLinkLibraryForTarget(const std::string& target,
                                         const std::string& lib,
                                         cmTargetLinkLibraryType llt)
{
  cmTargets::iterator i = this->Targets.find(target);
  if ( i != this->Targets.end())
    {
    cmTarget* tgt = this->GetGlobalGenerator()->FindTarget(lib);
    if(tgt)
      {
      // if it is not a static or shared library then you can not link to it
      if(!((tgt->GetType() == cmState::STATIC_LIBRARY) ||
           (tgt->GetType() == cmState::SHARED_LIBRARY) ||
           (tgt->GetType() == cmState::INTERFACE_LIBRARY) ||
           tgt->IsExecutableWithExports()))
        {
        std::ostringstream e;
        e << "Target \"" << lib << "\" of type "
          << cmState::GetTargetTypeName(tgt->GetType())
          << " may not be linked into another target.  "
          << "One may link only to STATIC or SHARED libraries, or "
          << "to executables with the ENABLE_EXPORTS property set.";
        this->IssueMessage(cmake::FATAL_ERROR, e.str());
        }
      }
    i->second.AddLinkLibrary( *this, target, lib, llt );
    }
  else
    {
    std::ostringstream e;
    e << "Attempt to add link library \""
      << lib << "\" to target \""
      << target << "\" which is not built in this directory.";
    this->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
}